

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSimpleDynamicsWorld.cpp
# Opt level: O2

void __thiscall
btSimpleDynamicsWorld::integrateTransforms(btSimpleDynamicsWorld *this,btScalar timeStep)

{
  int iVar1;
  btRigidBody *this_00;
  int i;
  long lVar2;
  btTransform predictedTrans;
  btTransform local_60;
  
  for (lVar2 = 0;
      lVar2 < (this->super_btDynamicsWorld).super_btCollisionWorld.m_collisionObjects.m_size;
      lVar2 = lVar2 + 1) {
    this_00 = (btRigidBody *)
              (this->super_btDynamicsWorld).super_btCollisionWorld.m_collisionObjects.m_data[lVar2];
    if ((((this_00 != (btRigidBody *)0x0) &&
         (((this_00->super_btCollisionObject).m_internalType & 2U) != 0)) &&
        (iVar1 = (this_00->super_btCollisionObject).m_activationState1, iVar1 != 2)) &&
       ((iVar1 != 5 && (((this_00->super_btCollisionObject).m_collisionFlags & 1) == 0)))) {
      btRigidBody::predictIntegratedTransform(this_00,timeStep,&local_60);
      btRigidBody::proceedToTransform(this_00,&local_60);
    }
  }
  return;
}

Assistant:

void	btSimpleDynamicsWorld::integrateTransforms(btScalar timeStep)
{
	btTransform predictedTrans;
	for ( int i=0;i<m_collisionObjects.size();i++)
	{
		btCollisionObject* colObj = m_collisionObjects[i];
		btRigidBody* body = btRigidBody::upcast(colObj);
		if (body)
		{
			if (body->isActive() && (!body->isStaticObject()))
			{
				body->predictIntegratedTransform(timeStep, predictedTrans);
				body->proceedToTransform( predictedTrans);
			}
		}
	}
}